

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_mqenc.c
# Opt level: O2

int jpc_mqenc_putbit(jpc_mqenc_t *mqenc,int bit)

{
  long lVar1;
  jpc_mqstate_t *pjVar2;
  uint_fast32_t uVar3;
  long lVar4;
  uchar *puVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  sbyte sVar10;
  ulong uVar11;
  uint_fast32_t uVar12;
  ulong uVar13;
  jas_stream_t *pjVar14;
  
  iVar7 = jas_getdbglevel();
  if (99 < iVar7) {
    jas_eprintf("jpc_mqenc_putbit(%p, %d)\n",mqenc,bit);
  }
  pjVar2 = *mqenc->curctx;
  uVar13 = pjVar2->qeval;
  uVar9 = mqenc->areg - uVar13;
  if ((uint)pjVar2->mps == bit) {
    mqenc->areg = uVar9;
    if ((short)uVar9 < 0) {
      mqenc->creg = mqenc->creg + uVar13;
    }
    else {
      jpc_mqenc_codemps2(mqenc);
    }
  }
  else {
    uVar11 = uVar13;
    uVar6 = 0;
    if (uVar9 < uVar13) {
      uVar11 = uVar9;
      uVar6 = uVar13;
    }
    uVar3 = mqenc->creg;
    *mqenc->curctx = pjVar2->nlps;
    uVar12 = mqenc->ctreg;
    uVar13 = uVar6 + uVar3;
    do {
      mqenc->areg = uVar11 * 2;
      uVar9 = uVar13 * 2;
      mqenc->creg = uVar9;
      uVar12 = uVar12 - 1;
      mqenc->ctreg = uVar12;
      if (uVar12 == 0) {
        lVar4 = mqenc->outbuf;
        if (lVar4 == 0xff) {
LAB_0012292d:
          pjVar14 = mqenc->out;
          uVar12 = 7;
          sVar10 = 0x14;
          if ((pjVar14->flags_ & 7U) == 0) {
            if ((-1 < pjVar14->rwlimit_) && (pjVar14->rwlimit_ <= pjVar14->rwcnt_)) {
              pjVar14->flags_ = pjVar14->flags_ | 4;
              goto LAB_0012293c;
            }
            *(byte *)&pjVar14->bufmode_ = (byte)pjVar14->bufmode_ | 0x20;
            iVar7 = pjVar14->cnt_;
            pjVar14->cnt_ = iVar7 + -1;
            if (iVar7 < 1) {
              iVar7 = jas_stream_flushbuf(pjVar14,0xff);
              uVar8 = 0xfffff;
              if (iVar7 != -1) goto LAB_00122aa4;
              goto LAB_0012293c;
            }
            pjVar14->rwcnt_ = pjVar14->rwcnt_ + 1;
            puVar5 = pjVar14->ptr_;
            pjVar14->ptr_ = puVar5 + 1;
            *puVar5 = 0xff;
          }
          else {
LAB_0012293c:
            *(byte *)&mqenc->err = (byte)mqenc->err | 1;
          }
          uVar8 = 0xfffff;
        }
        else {
          if (((uint)uVar13 >> 0x1a & 1) == 0) {
            if (-1 < lVar4) {
              pjVar14 = mqenc->out;
              uVar8 = pjVar14->flags_;
              if ((uVar8 & 7) == 0) {
                if ((pjVar14->rwlimit_ < 0) || (pjVar14->rwcnt_ < pjVar14->rwlimit_)) {
                  *(byte *)&pjVar14->bufmode_ = (byte)pjVar14->bufmode_ | 0x20;
                  iVar7 = pjVar14->cnt_;
                  pjVar14->cnt_ = iVar7 + -1;
                  if (iVar7 < 1) {
                    uVar8 = (uint)lVar4;
LAB_00122a90:
                    iVar7 = jas_stream_flushbuf(pjVar14,uVar8 & 0xff);
                    if (iVar7 == -1) goto LAB_00122a9a;
                  }
                  else {
                    pjVar14->rwcnt_ = pjVar14->rwcnt_ + 1;
                    puVar5 = pjVar14->ptr_;
                    pjVar14->ptr_ = puVar5 + 1;
                    *puVar5 = (uchar)lVar4;
                  }
                  goto LAB_00122a9e;
                }
LAB_00122a80:
                pjVar14->flags_ = uVar8 | 4;
              }
LAB_00122a9a:
              *(byte *)&mqenc->err = (byte)mqenc->err | 1;
            }
          }
          else {
            lVar1 = lVar4 + 1;
            mqenc->outbuf = lVar1;
            if (lVar1 == 0xff) {
              mqenc->creg = (ulong)((uint)uVar9 & 0x7fffffe);
              goto LAB_0012292d;
            }
            if (-2 < lVar4) {
              pjVar14 = mqenc->out;
              uVar8 = pjVar14->flags_;
              if ((uVar8 & 7) != 0) goto LAB_00122a9a;
              if ((-1 < pjVar14->rwlimit_) && (pjVar14->rwlimit_ <= pjVar14->rwcnt_))
              goto LAB_00122a80;
              *(byte *)&pjVar14->bufmode_ = (byte)pjVar14->bufmode_ | 0x20;
              iVar7 = pjVar14->cnt_;
              pjVar14->cnt_ = iVar7 + -1;
              if (iVar7 < 1) {
                uVar8 = (uint)lVar1;
                goto LAB_00122a90;
              }
              pjVar14->rwcnt_ = pjVar14->rwcnt_ + 1;
              puVar5 = pjVar14->ptr_;
              pjVar14->ptr_ = puVar5 + 1;
              *puVar5 = (uchar)lVar1;
            }
          }
LAB_00122a9e:
          uVar8 = 0x7ffff;
          sVar10 = 0x13;
          uVar12 = 8;
        }
LAB_00122aa4:
        mqenc->lastbyte = mqenc->outbuf;
        mqenc->outbuf = mqenc->creg >> sVar10 & 0xff;
        uVar9 = (ulong)((uint)mqenc->creg & uVar8);
        mqenc->creg = uVar9;
        mqenc->ctreg = uVar12;
      }
      uVar11 = mqenc->areg;
      uVar13 = uVar9;
    } while (-1 < (short)uVar11);
  }
  return -(uint)(mqenc->err != 0);
}

Assistant:

int jpc_mqenc_putbit(jpc_mqenc_t *mqenc, int bit)
{
	const jpc_mqstate_t *state;
	JAS_DBGLOG(100, ("jpc_mqenc_putbit(%p, %d)\n", mqenc, bit));
	JPC_MQENC_CALL(100, jpc_mqenc_dump(mqenc, stderr));

	state = *(mqenc->curctx);

	if (state->mps == bit) {
		/* Apply the CODEMPS algorithm as defined in the standard. */
		mqenc->areg -= state->qeval;
		if (!(mqenc->areg & 0x8000)) {
			jpc_mqenc_codemps2(mqenc);
		} else {
			mqenc->creg += state->qeval;
		}
	} else {
		/* Apply the CODELPS algorithm as defined in the standard. */
		jpc_mqenc_codelps2(mqenc->areg, mqenc->creg, mqenc->ctreg, mqenc->curctx, mqenc);
	}

	return jpc_mqenc_error(mqenc) ? (-1) : 0;
}